

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O0

bool __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
::_positive_vine_swap
          (RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
           *this,Index columnIndex)

{
  bool bVar1;
  Pos_index targetIndex;
  Pos_index columnIndex_00;
  uint uVar2;
  ID_index IVar3;
  Master_RU_matrix *pMVar4;
  Pos_index iiDeath;
  Pos_index iDeath;
  Index columnIndex_local;
  RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
  *this_local;
  
  targetIndex = _get_death(this,columnIndex);
  columnIndex_00 = _get_death(this,columnIndex + 1);
  uVar2 = Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>
          ::get_null_value<unsigned_int>();
  if ((targetIndex != uVar2) &&
     (uVar2 = Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>
              ::get_null_value<unsigned_int>(), columnIndex_00 != uVar2)) {
    pMVar4 = _matrix(this);
    IVar3 = _get_row_id_from_position(this,columnIndex);
    bVar1 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
            ::is_zero_entry(&pMVar4->reducedMatrixR_,columnIndex_00,IVar3);
    if (!bVar1) {
      if (targetIndex < columnIndex_00) {
        _swap_at_index(this,columnIndex);
        _add_to(this,targetIndex,columnIndex_00);
        _positive_transpose(this,columnIndex);
        return true;
      }
      _swap_at_index(this,columnIndex);
      _add_to(this,columnIndex_00,targetIndex);
      return false;
    }
  }
  _swap_at_index(this,columnIndex);
  uVar2 = Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>
          ::get_null_value<unsigned_int>();
  if ((targetIndex == uVar2) &&
     (uVar2 = Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>
              ::get_null_value<unsigned_int>(), columnIndex_00 != uVar2)) {
    pMVar4 = _matrix(this);
    IVar3 = _get_row_id_from_position(this,columnIndex + 1);
    bVar1 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
            ::is_zero_entry(&pMVar4->reducedMatrixR_,columnIndex_00,IVar3);
    if (!bVar1) {
      return false;
    }
  }
  _positive_transpose(this,columnIndex);
  return true;
}

Assistant:

inline bool RU_vine_swap<Master_matrix>::_positive_vine_swap(Index columnIndex) 
{
  const Pos_index iDeath = _get_death(columnIndex);
  const Pos_index iiDeath = _get_death(columnIndex + 1);

  if (iDeath != Master_matrix::template get_null_value<Pos_index>() &&
      iiDeath != Master_matrix::template get_null_value<Pos_index>() &&
      !(_matrix()->reducedMatrixR_.is_zero_entry(iiDeath, _get_row_id_from_position(columnIndex)))) {
    if (iDeath < iiDeath) {
      _swap_at_index(columnIndex);
      _add_to(iDeath, iiDeath);
      _positive_transpose(columnIndex);
      return true;
    }

    _swap_at_index(columnIndex);
    _add_to(iiDeath, iDeath);
    return false;
  }

  _swap_at_index(columnIndex);

  if (iDeath != Master_matrix::template get_null_value<Pos_index>() ||
      iiDeath == Master_matrix::template get_null_value<Pos_index>() ||
      _matrix()->reducedMatrixR_.is_zero_entry(iiDeath, _get_row_id_from_position(columnIndex + 1))) {
    _positive_transpose(columnIndex);
    return true;
  }
  return false;
}